

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O1

void __thiscall
Infector::AnyShared<concreteABC,_IA,_IB,_IC>::setPtr
          (AnyShared<concreteABC,_IA,_IB,_IC> *this,void *p)

{
  mapped_type *ppvVar1;
  concreteABC *base;
  key_type local_18;
  
  std::__shared_ptr<concreteABC,_(__gnu_cxx::_Lock_policy)2>::reset<concreteABC>
            (&(this->ist).super___shared_ptr<concreteABC,_(__gnu_cxx::_Lock_policy)2>,
             (concreteABC *)p);
  local_18._M_target = (type_info *)&concreteABC::typeinfo;
  ppvVar1 = std::__detail::
            _Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->multi_solver,&local_18);
  *ppvVar1 = p;
  AnyShared<concreteABC,IA,IB,IC>::resolve_multiple_cast<IA,IB,IC>
            ((AnyShared<concreteABC,IA,IB,IC> *)this,(concreteABC *)p);
  return;
}

Assistant:

virtual void setPtr(void * p) override {
            T* tp = reinterpret_cast<T*>(p);
            try{
                ist.reset(tp);
                resolve_multiple_cast<T,Bases...>(tp);
            }catch(std::exception & ex){
                multi_solver.clear();
                throw ex;
            }catch(...){
                multi_solver.clear();
                throw ExUnkownException();
            }
        }